

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddConvexHull
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *pointlist,
          ChVector<double> *pos,ChMatrix33<double> *rot)

{
  ChVector<double> *pCVar1;
  pointer pCVar2;
  long lVar3;
  long lVar4;
  ChCollisionShapeBullet *this_00;
  cbtConvexHullShape *this_01;
  double *pdVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ChConvexHullLibraryWrapper lh;
  cbtVector3 local_150;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_140;
  ChTriangleMeshConnected mmesh;
  
  pCVar2 = (pointlist->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pointlist->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2;
  auVar10._8_8_ = 0x41cdcd6500000000;
  auVar10._0_8_ = 0x41cdcd6500000000;
  auVar9._8_8_ = 0xc1cdcd6500000000;
  auVar9._0_8_ = 0xc1cdcd6500000000;
  auVar11 = ZEXT816(0xc1cdcd6500000000);
  auVar13 = ZEXT816(0x41cdcd6500000000);
  pdVar5 = pCVar2->m_data + 2;
  lVar4 = lVar3 / 0x18;
  while (bVar8 = lVar4 != 0, lVar4 = lVar4 + -1, bVar8) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *pdVar5;
    pCVar1 = (ChVector<double> *)(pdVar5 + -2);
    pdVar5 = pdVar5 + 3;
    auVar11 = vmaxsd_avx(auVar11,auVar14);
    auVar9 = vmaxpd_avx(auVar9,*(undefined1 (*) [16])pCVar1->m_data);
    auVar10 = vminpd_avx(auVar10,*(undefined1 (*) [16])pCVar1->m_data);
    auVar13 = vminsd_avx(auVar13,auVar14);
  }
  auVar10 = vsubpd_avx(auVar9,auVar10);
  auVar9 = vshufpd_avx(auVar10,auVar10,1);
  auVar9 = vminsd_avx(auVar10,auVar9);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar11._0_8_ - auVar13._0_8_;
  vminsd_avx(auVar9,auVar12);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])(this,material,lVar3 % 0x18);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(this);
  bt_utils::ChConvexHullLibraryWrapper::ChConvexHullLibraryWrapper(&lh);
  mmesh.m_filename._M_dataplus._M_p = (pointer)&mmesh.m_filename.field_2;
  auVar9 = ZEXT816(0) << 0x40;
  mmesh._8_64_ = ZEXT1664(auVar9);
  mmesh.super_ChTriangleMesh.super_ChGeometry._vptr_ChGeometry =
       (ChGeometry)&PTR__ChTriangleMeshConnected_0118aa20;
  mmesh.m_face_uv_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mmesh.m_face_n_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar9._0_8_;
  mmesh.m_face_n_indices.
  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)auVar9._8_8_;
  mmesh._160_40_ = ZEXT1640(auVar9);
  mmesh.m_face_mat_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data = (_Vector_base<int,_std::allocator<int>_>)(_Vector_impl)0x0;
  mmesh.m_filename._M_string_length = 0;
  mmesh.m_filename.field_2._M_local_buf[0] = '\0';
  mmesh._72_64_ = mmesh._8_64_;
  bt_utils::ChConvexHullLibraryWrapper::ComputeHull(&lh,pointlist,&mmesh);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])(this);
  auVar11._8_4_ = 0x80000000;
  auVar11._0_8_ = 0x8000000080000000;
  auVar11._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(auVar9,auVar11);
  geometry::ChTriangleMeshConnected::MakeOffset(&mmesh,(double)auVar9._0_4_);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_140,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChCollisionShapeBullet::ChCollisionShapeBullet
            (this_00,CONVEXHULL,(shared_ptr<chrono::ChMaterialSurface> *)&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
  this_01 = (cbtConvexHullShape *)cbtConvexHullShape::operator_new(0x98);
  uVar6 = 0;
  cbtConvexHullShape::cbtConvexHullShape(this_01,(cbtScalar *)0x0,0,0x10);
  while( true ) {
    uVar7 = (ulong)uVar6;
    if ((ulong)(((long)mmesh.m_vertices.
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)mmesh.m_vertices.
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar7) break;
    local_150.m_floats[2] =
         (cbtScalar)
         mmesh.m_vertices.
         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar7].m_data[2];
    auVar9 = vcvtpd2ps_avx(*(undefined1 (*) [16])
                            mmesh.m_vertices.
                            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7].m_data);
    local_150.m_floats._0_8_ = vmovlps_avx(auVar9);
    local_150.m_floats[3] = 0.0;
    cbtConvexHullShape::addPoint(this_01,&local_150,true);
    uVar6 = uVar6 + 1;
  }
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*(this_01->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
    super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xb])(this_01);
  cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb
            ((cbtPolyhedralConvexAabbCachingShape *)this_01);
  this_00->m_bt_shape = (cbtCollisionShape *)this_01;
  injectShape(this,pos,rot,this_00);
  geometry::ChTriangleMeshConnected::~ChTriangleMeshConnected(&mmesh);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddConvexHull(std::shared_ptr<ChMaterialSurface> material,
                                           const std::vector<ChVector<double>>& pointlist,
                                           const ChVector<>& pos,
                                           const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    ChVector<> aabbMax(-1e9, -1e9, -1e9);
    ChVector<> aabbMin(1e9, 1e9, 1e9);
    for (size_t i = 0; i < pointlist.size(); ++i) {
        aabbMax.x() = ChMax(aabbMax.x(), pointlist[i].x());
        aabbMax.y() = ChMax(aabbMax.y(), pointlist[i].y());
        aabbMax.z() = ChMax(aabbMax.z(), pointlist[i].z());
        aabbMin.x() = ChMin(aabbMin.x(), pointlist[i].x());
        aabbMin.y() = ChMin(aabbMin.y(), pointlist[i].y());
        aabbMin.z() = ChMin(aabbMin.z(), pointlist[i].z());
    }
    ChVector<> aabbsize = aabbMax - aabbMin;
    double approx_chord = ChMin(ChMin(aabbsize.x(), aabbsize.y()), aabbsize.z());
    // override the inward margin if larger than 0.2 chord:
    SetSafeMargin((cbtScalar)ChMin(GetSafeMargin(), approx_chord * 0.2));

    // shrink the convex hull by GetSafeMargin()
    bt_utils::ChConvexHullLibraryWrapper lh;
    geometry::ChTriangleMeshConnected mmesh;
    lh.ComputeHull(pointlist, mmesh);
    mmesh.MakeOffset(-GetSafeMargin());

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::CONVEXHULL, material);

    auto bt_shape = new cbtConvexHullShape;
    for (unsigned int i = 0; i < mmesh.m_vertices.size(); i++) {
        bt_shape->addPoint(cbtVector3((cbtScalar)mmesh.m_vertices[i].x(), (cbtScalar)mmesh.m_vertices[i].y(),
                                      (cbtScalar)mmesh.m_vertices[i].z()));
    }
    bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
    bt_shape->recalcLocalAabb();
    shape->m_bt_shape = bt_shape;

    injectShape(pos, rot, shape);
    return true;
}